

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::CreateAndSetGlobalGenerator(cmake *this,string *name,bool allowArch)

{
  int iVar1;
  long lVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string vsError;
  string kdevError;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_e0;
  _Rb_tree_node_base *local_d8;
  char *local_d0;
  _Rb_tree_node_base local_c8;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [16];
  pointer local_68;
  pointer local_60;
  pointer local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  char *local_40;
  _Rb_tree_node_base *local_38;
  
  CreateGlobalGenerator((cmake *)local_78,(string *)this,SUB81(name,0));
  if ((cmGlobalGenerator *)local_78._0_8_ == (cmGlobalGenerator *)0x0) {
    local_c8._M_right = (_Base_ptr)0x0;
    local_a8[0] = 0;
    local_d0 = (char *)0x0;
    local_c8._M_color._0_1_ = _S_red;
    local_d8 = &local_c8;
    local_c8._M_left = (_Base_ptr)local_a8;
    lVar2 = std::__cxx11::string::find((char *)name,0x765f46,0);
    if (lVar2 != -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8._M_left,0,(char *)local_c8._M_right,0x765f50);
    }
    if (!allowArch) {
      local_68 = (pointer)(name->_M_dataplus)._M_p;
      local_78._8_8_ = name->_M_string_length;
      __str._M_str = "Visual Studio ";
      __str._M_len = 0xe;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 8),0,0xe,
                         __str);
      if ((iVar1 == 0) && (0x15 < name->_M_string_length)) {
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x765f92);
      }
    }
    local_58 = (pointer)(name->_M_dataplus)._M_p;
    local_60 = (pointer)name->_M_string_length;
    local_78._8_8_ = (pointer)0x21;
    local_68 = (pointer)0x765feb;
    local_50 = local_c8._M_right;
    local_48 = local_c8._M_left;
    local_40 = local_d0;
    local_38 = local_d8;
    views._M_len = 4;
    views._M_array = (iterator)(local_78 + 8);
    cmCatViews_abi_cxx11_((string *)(local_a8 + 0x10),views);
    cmSystemTools::Error((string *)(local_a8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._16_8_ != &local_88) {
      operator_delete((void *)local_a8._16_8_,local_88._M_allocated_capacity + 1);
    }
    PrintGeneratorList(this);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,CONCAT71(local_c8._1_7_,(undefined1)local_c8._M_color) + 1);
    }
    if (local_c8._M_left != (_Base_ptr)local_a8) {
      operator_delete(local_c8._M_left,CONCAT71(local_a8._1_7_,local_a8[0]) + 1);
    }
  }
  else {
    local_e0._M_head_impl = (cmGlobalGenerator *)local_78._0_8_;
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&local_e0);
    if (local_e0._M_head_impl != (cmGlobalGenerator *)0x0) {
      (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                   *)&(local_e0._M_head_impl)->_vptr_cmGlobalGenerator)->
                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                )._M_t.
                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                _vptr_cmGlobalGeneratorFactory)();
    }
  }
  return (cmGlobalGenerator *)local_78._0_8_ != (cmGlobalGenerator *)0x0;
}

Assistant:

bool cmake::CreateAndSetGlobalGenerator(const std::string& name,
                                        bool allowArch)
{
  auto gen = this->CreateGlobalGenerator(name, allowArch);
  if (!gen) {
    std::string kdevError;
    std::string vsError;
    if (name.find("KDevelop3", 0) != std::string::npos) {
      kdevError = "\nThe KDevelop3 generator is not supported anymore.";
    }
    if (!allowArch && cmHasLiteralPrefix(name, "Visual Studio ") &&
        name.length() >= cmStrLen("Visual Studio xx xxxx ")) {
      vsError = "\nUsing platforms in Visual Studio generator names is not "
                "supported in CMakePresets.json.";
    }

    cmSystemTools::Error(
      cmStrCat("Could not create named generator ", name, kdevError, vsError));
    this->PrintGeneratorList();
    return false;
  }

  this->SetGlobalGenerator(std::move(gen));
  return true;
}